

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O2

void __thiscall Num::delereZeros(Num *this,Num *number)

{
  string *__lhs;
  bool bVar1;
  ulong uVar2;
  short sVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = (number->base)._M_string_length;
  __lhs = &number->base;
  uVar4 = uVar2 & 0xffffffff;
  while( true ) {
    sVar3 = (short)uVar4;
    uVar5 = ((uint)uVar4 & 0xffff) - 1;
    if (((ushort)uVar5 < (ushort)uVar2) && ((__lhs->_M_dataplus)._M_p[uVar5 & 0xffff] != '0'))
    break;
    if (sVar3 == 1) {
      bVar1 = std::operator==(__lhs,"0");
      if (bVar1) break;
    }
    bVar1 = std::operator==(__lhs,"");
    uVar4 = (ulong)(ushort)(sVar3 - 1);
    if ((sVar3 == 0) && (bVar1)) break;
    std::__cxx11::string::erase((ulong)__lhs,(long)(int)uVar5);
    uVar2 = (number->base)._M_string_length;
  }
  number->size = (Short)(number->base)._M_string_length;
  return;
}

Assistant:

void Num::delereZeros(Num& number) // delete insignificant zeros
{
    Num::Short k = number.getSize();
    while (number.getDigit(k - 1) == 0)
    {
        if ((k == 1 && number.base == "0") || (number.base == "" && k == 0))
            break;
        number.base.erase(k - 1);
        --k;
    }
    number.size = number.base.size();
}